

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O1

TemplateDictionary * MakeDictionary(int i)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  TemplateString TVar19;
  TemplateString TVar20;
  TemplateString TVar21;
  TemplateString TVar22;
  TemplateString TVar23;
  TemplateString TVar24;
  TemplateString TVar25;
  TemplateString TVar26;
  TemplateString TVar27;
  TemplateString TVar28;
  TemplateString TVar29;
  TemplateString TVar30;
  TemplateString TVar31;
  TemplateString TVar32;
  TemplateString TVar33;
  TemplateString TVar34;
  TemplateString TVar35;
  TemplateString TVar36;
  TemplateString TVar37;
  TemplateString TVar38;
  TemplateString TVar39;
  TemplateString TVar40;
  TemplateString TVar41;
  TemplateString TVar42;
  TemplateString TVar43;
  TemplateString TVar44;
  TemplateString TVar45;
  TemplateString TVar46;
  TemplateString TVar47;
  TemplateString TVar48;
  TemplateString TVar49;
  TemplateString TVar50;
  TemplateString TVar51;
  TemplateString TVar52;
  TemplateString TVar53;
  TemplateString TVar54;
  TemplateString TVar55;
  TemplateString TVar56;
  TemplateString TVar57;
  TemplateString TVar58;
  TemplateString TVar59;
  TemplateString TVar60;
  TemplateString TVar61;
  TemplateString TVar62;
  TemplateString TVar63;
  TemplateString TVar64;
  TemplateString TVar65;
  TemplateString TVar66;
  TemplateString TVar67;
  TemplateString TVar68;
  TemplateString TVar69;
  TemplateString TVar70;
  TemplateString TVar71;
  TemplateString TVar72;
  TemplateString TVar73;
  TemplateString TVar74;
  TemplateString TVar75;
  TemplateString TVar76;
  TemplateString TVar77;
  TemplateString TVar78;
  TemplateString TVar79;
  TemplateString TVar80;
  TemplateString TVar81;
  TemplateString TVar82;
  TemplateString TVar83;
  TemplateString TVar84;
  TemplateString TVar85;
  TemplateString TVar86;
  TemplateString TVar87;
  TemplateString TVar88;
  TemplateString TVar89;
  TemplateString TVar90;
  TemplateString TVar91;
  TemplateString TVar92;
  TemplateString TVar93;
  TemplateString TVar94;
  TemplateString TVar95;
  TemplateString TVar96;
  TemplateString TVar97;
  TemplateString TVar98;
  TemplateString TVar99;
  TemplateString TVar100;
  TemplateString TVar101;
  TemplateString TVar102;
  TemplateString TVar103;
  TemplateString TVar104;
  TemplateString TVar105;
  TemplateString TVar106;
  TemplateString TVar107;
  undefined8 uVar108;
  TemplateDictionary *this;
  TemplateModifier *pTVar109;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  ulong uVar110;
  TemplateString local_d50;
  char *local_d30;
  undefined8 uStack_d28;
  undefined1 local_d20;
  undefined7 uStack_d1f;
  undefined8 uStack_d18;
  char *local_d10;
  undefined8 uStack_d08;
  undefined1 local_d00;
  undefined7 uStack_cff;
  undefined8 uStack_cf8;
  char *local_cf0;
  undefined8 uStack_ce8;
  undefined1 local_ce0;
  undefined7 uStack_cdf;
  undefined8 uStack_cd8;
  char *local_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0;
  undefined5 uStack_cbf;
  undefined2 uStack_cba;
  undefined6 uStack_cb8;
  undefined1 uStack_cb2;
  undefined1 uStack_cb1;
  char *local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  ulong uStack_c98;
  char *local_c90;
  undefined8 uStack_c88;
  undefined1 local_c80;
  undefined7 uStack_c7f;
  undefined8 uStack_c78;
  char *local_c70;
  undefined8 uStack_c68;
  undefined1 local_c60;
  undefined7 uStack_c5f;
  undefined8 uStack_c58;
  char *local_c50;
  undefined8 uStack_c48;
  undefined1 local_c40;
  undefined7 uStack_c3f;
  undefined8 uStack_c38;
  char *local_c30;
  undefined8 uStack_c28;
  undefined1 local_c20;
  undefined7 uStack_c1f;
  undefined8 uStack_c18;
  char *local_c10;
  undefined8 uStack_c08;
  undefined1 local_c00;
  undefined7 uStack_bff;
  undefined8 uStack_bf8;
  char *local_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0;
  undefined7 uStack_bdf;
  undefined8 uStack_bd8;
  char *local_bd0;
  undefined8 uStack_bc8;
  undefined1 local_bc0;
  undefined7 uStack_bbf;
  undefined8 uStack_bb8;
  char *local_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0;
  undefined7 uStack_b9f;
  undefined8 uStack_b98;
  char *local_b90;
  undefined8 uStack_b88;
  undefined1 local_b80;
  undefined7 uStack_b7f;
  undefined8 uStack_b78;
  char *local_b70;
  undefined8 uStack_b68;
  undefined1 local_b60;
  undefined7 uStack_b5f;
  undefined8 uStack_b58;
  char *local_b50;
  undefined8 uStack_b48;
  undefined1 local_b40;
  undefined7 uStack_b3f;
  undefined8 uStack_b38;
  char *local_b30;
  undefined8 uStack_b28;
  undefined1 local_b20;
  undefined7 uStack_b1f;
  undefined8 uStack_b18;
  char *local_b10;
  undefined8 uStack_b08;
  undefined1 local_b00;
  undefined7 uStack_aff;
  undefined8 uStack_af8;
  char *local_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0;
  undefined7 uStack_adf;
  undefined8 uStack_ad8;
  char *local_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0;
  undefined7 uStack_abf;
  undefined8 uStack_ab8;
  char *local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0;
  undefined7 uStack_a9f;
  undefined8 uStack_a98;
  char *local_a90;
  undefined8 uStack_a88;
  undefined1 local_a80;
  undefined7 uStack_a7f;
  undefined8 uStack_a78;
  char *local_a70;
  undefined8 uStack_a68;
  undefined1 local_a60;
  undefined7 uStack_a5f;
  undefined8 uStack_a58;
  char *local_a50;
  undefined8 uStack_a48;
  undefined1 local_a40;
  undefined7 uStack_a3f;
  undefined8 uStack_a38;
  char *local_a30;
  undefined8 uStack_a28;
  undefined1 local_a20;
  undefined7 uStack_a1f;
  undefined8 uStack_a18;
  char *local_a10;
  undefined8 uStack_a08;
  undefined1 local_a00;
  undefined7 uStack_9ff;
  undefined8 uStack_9f8;
  char *local_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0;
  undefined7 uStack_9df;
  undefined8 uStack_9d8;
  char *local_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0;
  undefined7 uStack_9bf;
  undefined8 uStack_9b8;
  char *local_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0;
  undefined7 uStack_99f;
  undefined8 uStack_998;
  char *local_990;
  undefined8 uStack_988;
  undefined1 local_980;
  undefined7 uStack_97f;
  undefined8 uStack_978;
  char *local_970;
  undefined8 uStack_968;
  undefined1 local_960;
  undefined7 uStack_95f;
  undefined8 uStack_958;
  char *local_950;
  undefined8 uStack_948;
  undefined1 local_940;
  undefined7 uStack_93f;
  undefined8 uStack_938;
  char *local_930;
  undefined8 uStack_928;
  undefined1 local_920;
  undefined7 uStack_91f;
  undefined8 uStack_918;
  char *local_910;
  undefined8 uStack_908;
  undefined1 local_900;
  undefined7 uStack_8ff;
  undefined8 uStack_8f8;
  char *local_8f0;
  undefined8 uStack_8e8;
  undefined1 local_8e0;
  undefined7 uStack_8df;
  undefined8 uStack_8d8;
  char *local_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0;
  undefined7 uStack_8bf;
  undefined8 uStack_8b8;
  char *local_8b0;
  undefined8 uStack_8a8;
  undefined1 local_8a0;
  undefined7 uStack_89f;
  undefined8 uStack_898;
  char *local_890;
  undefined8 uStack_888;
  undefined1 local_880;
  undefined7 uStack_87f;
  undefined8 uStack_878;
  char *local_870;
  undefined8 uStack_868;
  undefined1 local_860;
  undefined7 uStack_85f;
  undefined8 uStack_858;
  char *local_850;
  undefined8 uStack_848;
  undefined1 local_840;
  undefined7 uStack_83f;
  undefined8 uStack_838;
  char *local_830;
  undefined8 uStack_828;
  undefined1 local_820;
  undefined7 uStack_81f;
  undefined8 uStack_818;
  char *local_810;
  undefined8 uStack_808;
  undefined1 local_800;
  undefined7 uStack_7ff;
  undefined8 uStack_7f8;
  char *local_7f0;
  undefined8 uStack_7e8;
  undefined4 local_7e0;
  undefined4 uStack_7dc;
  undefined8 uStack_7d8;
  char *local_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0;
  undefined3 uStack_7bf;
  undefined8 uStack_7b8;
  char *local_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0;
  undefined7 uStack_79f;
  undefined8 uStack_798;
  char *local_790;
  undefined8 uStack_788;
  undefined1 local_780;
  undefined7 uStack_77f;
  undefined8 uStack_778;
  char *local_770;
  undefined8 uStack_768;
  undefined1 local_760;
  undefined7 uStack_75f;
  undefined8 uStack_758;
  char *local_750;
  undefined8 uStack_748;
  undefined1 local_740;
  undefined7 uStack_73f;
  undefined8 uStack_738;
  char *local_730;
  undefined8 uStack_728;
  undefined1 local_720;
  undefined7 uStack_71f;
  undefined8 uStack_718;
  char *local_710;
  undefined8 uStack_708;
  undefined1 local_700;
  undefined7 uStack_6ff;
  undefined8 uStack_6f8;
  char *local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0;
  undefined7 uStack_6df;
  undefined8 uStack_6d8;
  char *local_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0;
  undefined7 uStack_6bf;
  undefined8 uStack_6b8;
  char *local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0;
  undefined7 uStack_69f;
  undefined8 uStack_698;
  char *local_690;
  undefined8 uStack_688;
  undefined1 local_680;
  undefined7 uStack_67f;
  undefined8 uStack_678;
  undefined1 *local_670;
  undefined8 uStack_668;
  undefined1 local_660;
  undefined7 uStack_65f;
  undefined8 uStack_658;
  char *local_650;
  undefined8 uStack_648;
  undefined1 local_640;
  undefined7 uStack_63f;
  undefined8 uStack_638;
  char *local_630;
  undefined8 uStack_628;
  undefined1 local_620;
  undefined7 uStack_61f;
  undefined8 uStack_618;
  char *local_610;
  undefined8 uStack_608;
  undefined1 local_600;
  undefined7 uStack_5ff;
  undefined8 uStack_5f8;
  char *local_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0;
  undefined7 uStack_5df;
  undefined8 uStack_5d8;
  char *local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0;
  undefined7 uStack_5bf;
  undefined8 uStack_5b8;
  char *local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0;
  undefined7 uStack_59f;
  undefined8 uStack_598;
  char *local_590;
  undefined8 uStack_588;
  undefined1 local_580;
  undefined7 uStack_57f;
  undefined8 uStack_578;
  char *local_570;
  undefined8 uStack_568;
  undefined1 local_560;
  undefined7 uStack_55f;
  undefined8 uStack_558;
  char *local_550;
  undefined8 uStack_548;
  undefined1 local_540;
  undefined7 uStack_53f;
  undefined8 uStack_538;
  char *local_530;
  undefined8 uStack_528;
  undefined1 local_520;
  undefined7 uStack_51f;
  undefined8 uStack_518;
  char *local_510;
  undefined8 uStack_508;
  undefined1 local_500;
  undefined7 uStack_4ff;
  undefined8 uStack_4f8;
  char *local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0;
  undefined7 uStack_4df;
  undefined8 uStack_4d8;
  char *local_4d0;
  undefined8 uStack_4c8;
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined8 uStack_4b8;
  char *local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0;
  undefined7 uStack_49f;
  undefined8 uStack_498;
  char *local_490;
  undefined8 uStack_488;
  undefined1 local_480;
  undefined7 uStack_47f;
  undefined8 uStack_478;
  char *local_470;
  undefined8 uStack_468;
  undefined1 local_460;
  undefined7 uStack_45f;
  undefined8 uStack_458;
  char *local_450;
  undefined8 uStack_448;
  undefined1 local_440;
  undefined7 uStack_43f;
  undefined8 uStack_438;
  char *local_430;
  undefined8 uStack_428;
  undefined1 local_420;
  undefined7 uStack_41f;
  undefined8 uStack_418;
  char *local_410;
  undefined8 uStack_408;
  undefined1 local_400;
  undefined7 uStack_3ff;
  undefined8 uStack_3f8;
  char *local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0;
  undefined7 uStack_3df;
  undefined8 uStack_3d8;
  char *local_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0;
  undefined7 uStack_3bf;
  undefined8 uStack_3b8;
  char *local_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0;
  undefined7 uStack_39f;
  undefined8 uStack_398;
  char *local_390;
  size_t sStack_388;
  undefined1 local_380;
  undefined7 uStack_37f;
  undefined8 uStack_378;
  char *local_370;
  undefined8 uStack_368;
  undefined1 local_360;
  undefined7 uStack_35f;
  undefined8 uStack_358;
  char *local_350;
  undefined8 uStack_348;
  undefined1 local_340;
  undefined7 uStack_33f;
  undefined8 uStack_338;
  char *local_330;
  undefined8 uStack_328;
  undefined1 local_320;
  undefined7 uStack_31f;
  undefined8 uStack_318;
  char *local_310;
  undefined8 uStack_308;
  undefined1 local_300;
  undefined7 uStack_2ff;
  undefined8 uStack_2f8;
  undefined8 *local_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0;
  uint7 uStack_2df;
  undefined8 uStack_2d8;
  char *local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0;
  undefined7 uStack_2bf;
  undefined8 uStack_2b8;
  char *local_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0;
  undefined7 uStack_29f;
  undefined8 uStack_298;
  char *local_290;
  undefined8 uStack_288;
  undefined1 local_280;
  undefined7 uStack_27f;
  undefined8 uStack_278;
  char *local_270;
  undefined8 uStack_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  undefined8 uStack_258;
  char *local_250;
  undefined8 uStack_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  undefined8 uStack_238;
  char *local_230;
  undefined8 uStack_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  undefined8 uStack_218;
  char *local_210;
  undefined8 uStack_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  undefined8 uStack_1f8;
  char *local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  undefined8 uStack_1d8;
  char *local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined8 uStack_1b8;
  char *local_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  char *local_190;
  undefined8 uStack_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  undefined8 uStack_178;
  char *local_170;
  undefined8 uStack_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined8 uStack_158;
  char *local_150;
  undefined8 uStack_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  undefined8 uStack_138;
  char *local_130;
  undefined8 uStack_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  char *local_110;
  undefined8 uStack_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  char *local_f0;
  undefined8 uStack_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  char *local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0;
  undefined3 uStack_bf;
  undefined8 uStack_b8;
  char *local_b0;
  undefined8 uStack_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  char *local_90;
  undefined8 uStack_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  char *local_70;
  undefined8 uStack_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  char *local_50;
  undefined8 uStack_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  if (i == 3) {
    this = (TemplateDictionary *)operator_new(0x70);
    local_d50.ptr_ = "dict3";
    local_d50.length_ = 5;
    local_d50.is_immutable_ = true;
    local_d50.id_ = 0;
    ctemplate::TemplateDictionary::TemplateDictionary(this,&local_d50,(UnsafeArena *)0x0);
    local_d50.ptr_ = "HEAD";
    local_d50.length_ = 4;
    local_d50.is_immutable_ = true;
    local_d50.id_ = 0;
    local_cf0 = "   ";
    uStack_ce8 = 3;
    local_ce0 = 1;
    uStack_cd8 = 0;
    TVar103._17_7_ = uStack_cdf;
    TVar103.is_immutable_ = true;
    TVar67.length_._0_4_ = 4;
    TVar67.ptr_ = "HEAD";
    TVar67.length_._4_4_ = 0;
    TVar67._16_4_ = (int)CONCAT71(local_d50._17_7_,1);
    TVar67._20_4_ = local_d50._20_4_;
    TVar67.id_ = 0;
    TVar103.length_ = 3;
    TVar103.ptr_ = "   ";
    TVar103.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar67,TVar103);
    local_d10 = "BODY";
    uStack_d08 = 4;
    local_d00 = 1;
    uStack_cf8 = 0;
    local_d30 = "\r\n";
    uStack_d28 = 2;
    local_d20 = 1;
    uStack_d18 = 0;
    TVar104._17_7_ = uStack_d1f;
    TVar104.is_immutable_ = true;
    TVar68.length_._0_4_ = 4;
    TVar68.ptr_ = "BODY";
    TVar68.length_._4_4_ = 0;
    TVar68._16_4_ = (int)CONCAT71(uStack_cff,1);
    TVar68._20_4_ = (int)((uint7)uStack_cff >> 0x18);
    TVar68.id_ = 0;
    TVar104.length_ = 2;
    TVar104.ptr_ = "\r\n";
    TVar104.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar68,TVar104);
  }
  else if (i == 2) {
    this = (TemplateDictionary *)operator_new(0x70);
    local_d50.ptr_ = "dict2";
    local_d50.length_ = 5;
    local_d50.is_immutable_ = true;
    local_d50.id_ = 0;
    ctemplate::TemplateDictionary::TemplateDictionary(this,&local_d50,(UnsafeArena *)0x0);
  }
  else {
    if (i != 1) {
      printf("%s: %d: ASSERT FAILED: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
             ,0x17a,"false");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                    ,0x17a,"TemplateDictionary *MakeDictionary(int)");
    }
    this = (TemplateDictionary *)operator_new(0x70);
    local_d50.ptr_ = "dict1";
    local_d50.length_ = 5;
    local_d50.is_immutable_ = true;
    local_d50.id_ = 0;
    ctemplate::TemplateDictionary::TemplateDictionary(this,&local_d50,(UnsafeArena *)0x0);
    local_d50.ptr_ = "just used for debugging, so doesn\'t matter.txt";
    local_d50.length_ = 0x2e;
    local_d50.is_immutable_ = true;
    local_d50.id_ = 0;
    TVar1.length_._0_4_ = 0x2e;
    TVar1.ptr_ = "just used for debugging, so doesn\'t matter.txt";
    TVar1.length_._4_4_ = 0;
    TVar1._16_4_ = (int)CONCAT71(local_d50._17_7_,1);
    TVar1._20_4_ = local_d50._20_4_;
    TVar1.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar1);
    local_cf0 = "HEAD";
    uStack_ce8 = 4;
    local_ce0 = 1;
    uStack_cd8 = 0;
    local_d10 = "   This is the head   ";
    uStack_d08 = 0x16;
    local_d00 = 1;
    uStack_cf8 = 0;
    TVar69._17_7_ = uStack_cff;
    TVar69.is_immutable_ = true;
    TVar2.length_._0_4_ = 4;
    TVar2.ptr_ = "HEAD";
    TVar2.length_._4_4_ = 0;
    TVar2._16_4_ = (int)CONCAT71(uStack_cdf,1);
    TVar2._20_4_ = (int)((uint7)uStack_cdf >> 0x18);
    TVar2.id_ = 0;
    TVar69.length_ = 0x16;
    TVar69.ptr_ = "   This is the head   ";
    TVar69.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar2,TVar69);
    local_d30 = "FOOTER_BAR_TEXT";
    uStack_d28 = 0xf;
    local_d20 = 1;
    uStack_d18 = 0;
    TVar3.length_._0_4_ = 0xf;
    TVar3.ptr_ = "FOOTER_BAR_TEXT";
    TVar3.length_._4_4_ = 0;
    TVar3._16_4_ = (int)CONCAT71(uStack_d1f,1);
    TVar3._20_4_ = (int)((uint7)uStack_d1f >> 0x18);
    TVar3.id_ = 0;
    pTVar109 = (TemplateModifier *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar3);
    local_50 = "BODY";
    uStack_48 = 4;
    local_40 = 1;
    uStack_38 = 0;
    local_70 = "Should never be shown";
    uStack_68 = 0x15;
    local_60 = 1;
    uStack_58 = 0;
    TVar70._17_7_ = uStack_5f;
    TVar70.is_immutable_ = true;
    TVar4.length_._0_4_ = 4;
    TVar4.ptr_ = "BODY";
    TVar4.length_._4_4_ = 0;
    TVar4._16_4_ = (int)CONCAT71(uStack_3f,1);
    TVar4._20_4_ = (int)((uint7)uStack_3f >> 0x18);
    TVar4.id_ = 0;
    TVar70.length_ = 0x15;
    TVar70.ptr_ = "Should never be shown";
    TVar70.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar4,TVar70);
    local_90 = "HOME_LINK";
    uStack_88 = 9;
    local_80 = 1;
    uStack_78 = 0;
    local_b0 = "<b>Time to go home!</b>";
    uStack_a8 = 0x17;
    local_a0 = 1;
    uStack_98 = 0;
    TVar71._17_7_ = uStack_9f;
    TVar71.is_immutable_ = true;
    TVar5.length_._0_4_ = 9;
    TVar5.ptr_ = "HOME_LINK";
    TVar5.length_._4_4_ = 0;
    TVar5._16_4_ = (int)CONCAT71(uStack_7f,1);
    TVar5._20_4_ = (int)((uint7)uStack_7f >> 0x18);
    TVar5.id_ = 0;
    TVar71.length_ = 0x17;
    TVar71.ptr_ = "<b>Time to go home!</b>";
    TVar71.id_ = 0;
    ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar71,pTVar109);
    local_d0 = "ADVERTISE_LINK";
    uStack_c8 = 0xe;
    _local_c0 = CONCAT31(uStack_bf,1);
    uStack_b8 = 0;
    ctemplate::TemplateDictionary::SetFormattedValue(pTVar109,"<b>Be advertiser #%d</b>",2);
    local_f0 = "ABOUT_GOOGLE_LINK";
    uStack_e8 = 0x11;
    local_e0 = 1;
    uStack_d8 = 0;
    local_110 = "<A HREF=/>About Google!</A>";
    uStack_108 = 0x1b;
    local_100 = 1;
    uStack_f8 = 0;
    TVar72._17_7_ = uStack_ff;
    TVar72.is_immutable_ = true;
    TVar6.length_._0_4_ = 0x11;
    TVar6.ptr_ = "ABOUT_GOOGLE_LINK";
    TVar6.length_._4_4_ = 0;
    TVar6._16_4_ = (int)CONCAT71(uStack_df,1);
    TVar6._20_4_ = (int)((uint7)uStack_df >> 0x18);
    TVar6.id_ = 0;
    TVar72.length_ = 0x1b;
    TVar72.ptr_ = "<A HREF=/>About Google!</A>";
    TVar72.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar6,TVar72);
    local_130 = "PROMO_LICENSING_SECTION";
    uStack_128 = 0x17;
    local_120 = 1;
    uStack_118 = 0;
    TVar7.length_._0_4_ = 0x17;
    TVar7.ptr_ = "PROMO_LICENSING_SECTION";
    TVar7.length_._4_4_ = 0;
    TVar7._16_4_ = (int)CONCAT71(uStack_11f,1);
    TVar7._20_4_ = (int)((uint7)uStack_11f >> 0x18);
    TVar7.id_ = 0;
    ctemplate::TemplateDictionary::ShowSection(TVar7);
    local_150 = "PROMO_LICENSING_LINK";
    uStack_148 = 0x14;
    local_140 = 1;
    uStack_138 = 0;
    local_170 = "<A HREF=\'foo\'>";
    uStack_168 = 0xe;
    local_160 = 1;
    uStack_158 = 0;
    TVar73._17_7_ = uStack_15f;
    TVar73.is_immutable_ = true;
    TVar8.length_._0_4_ = 0x14;
    TVar8.ptr_ = "PROMO_LICENSING_LINK";
    TVar8.length_._4_4_ = 0;
    TVar8._16_4_ = (int)CONCAT71(uStack_13f,1);
    TVar8._20_4_ = (int)((uint7)uStack_13f >> 0x18);
    TVar8.id_ = 0;
    TVar73.length_ = 0xe;
    TVar73.ptr_ = "<A HREF=\'foo\'>";
    TVar73.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar8,TVar73);
    local_190 = "TRIM_LINE_COLOR";
    uStack_188 = 0xf;
    local_180 = 1;
    uStack_178 = 0;
    local_1b0 = "Who cares?";
    uStack_1a8 = 10;
    local_1a0 = 1;
    uStack_198 = 0;
    TVar74._17_7_ = uStack_19f;
    TVar74.is_immutable_ = true;
    TVar9.length_._0_4_ = 0xf;
    TVar9.ptr_ = "TRIM_LINE_COLOR";
    TVar9.length_._4_4_ = 0;
    TVar9._16_4_ = (int)CONCAT71(uStack_17f,1);
    TVar9._20_4_ = (int)((uint7)uStack_17f >> 0x18);
    TVar9.id_ = 0;
    TVar74.length_ = 10;
    TVar74.ptr_ = "Who cares?";
    TVar74.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar9,TVar74);
    local_1d0 = "TRIM_LINE_HEIGHT";
    uStack_1c8 = 0x10;
    local_1c0 = 1;
    uStack_1b8 = 0;
    TVar10.length_._0_4_ = 0x10;
    TVar10.ptr_ = "TRIM_LINE_HEIGHT";
    TVar10.length_._4_4_ = 0;
    TVar10._16_4_ = (int)CONCAT71(uStack_1bf,1);
    TVar10._20_4_ = (int)((uint7)uStack_1bf >> 0x18);
    TVar10.id_ = 0;
    ctemplate::TemplateDictionary::SetIntValue(TVar10,(long)this);
    local_1f0 = "MODIFIED_BY_GOOGLE";
    uStack_1e8 = 0x12;
    local_1e0 = 1;
    uStack_1d8 = 0;
    TVar11.length_._0_4_ = 0x12;
    TVar11.ptr_ = "MODIFIED_BY_GOOGLE";
    TVar11.length_._4_4_ = 0;
    TVar11._16_4_ = (int)CONCAT71(uStack_1df,1);
    TVar11._20_4_ = (int)((uint7)uStack_1df >> 0x18);
    TVar11.id_ = 0;
    ctemplate::TemplateDictionary::SetIntValue(TVar11,(long)this);
    local_210 = "MSG_copyright";
    uStack_208 = 0xd;
    local_200 = 1;
    uStack_1f8 = 0;
    local_230 = "&copy; Google Inc. (all rights reserved)";
    uStack_228 = 0x28;
    local_220 = 1;
    uStack_218 = 0;
    TVar75._17_7_ = uStack_21f;
    TVar75.is_immutable_ = true;
    TVar12.length_._0_4_ = 0xd;
    TVar12.ptr_ = "MSG_copyright";
    TVar12.length_._4_4_ = 0;
    TVar12._16_4_ = (int)CONCAT71(uStack_1ff,1);
    TVar12._20_4_ = (int)((uint7)uStack_1ff >> 0x18);
    TVar12.id_ = 0;
    TVar75.length_ = 0x28;
    TVar75.ptr_ = "&copy; Google Inc. (all rights reserved)";
    TVar75.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar12,TVar75);
    local_250 = "CLOSING_DIV_SECTION";
    uStack_248 = 0x13;
    local_240 = 1;
    uStack_238 = 0;
    TVar13.length_._0_4_ = 0x13;
    TVar13.ptr_ = "CLOSING_DIV_SECTION";
    TVar13.length_._4_4_ = 0;
    TVar13._16_4_ = (int)CONCAT71(uStack_23f,1);
    TVar13._20_4_ = (int)((uint7)uStack_23f >> 0x18);
    TVar13.id_ = 0;
    ctemplate::TemplateDictionary::ShowSection(TVar13);
    local_270 = "LATENCY_PREFETCH_URL";
    uStack_268 = 0x14;
    local_260 = 1;
    uStack_258 = 0;
    local_290 = "/huh?";
    uStack_288 = 5;
    local_280 = 1;
    uStack_278 = 0;
    local_2b0 = "UNUSED_SECTION_NAME";
    uStack_2a8 = 0x13;
    local_2a0 = 1;
    uStack_298 = 0;
    TVar105._17_7_ = uStack_29f;
    TVar105.is_immutable_ = true;
    TVar76._17_7_ = uStack_27f;
    TVar76.is_immutable_ = true;
    TVar14.length_._0_4_ = 0x14;
    TVar14.ptr_ = "LATENCY_PREFETCH_URL";
    TVar14.length_._4_4_ = 0;
    TVar14._16_4_ = (int)CONCAT71(uStack_25f,1);
    TVar14._20_4_ = (int)((uint7)uStack_25f >> 0x18);
    TVar14.id_ = 0;
    TVar76.length_ = 5;
    TVar76.ptr_ = "/huh?";
    TVar76.id_ = 0;
    TVar105.length_ = 0x13;
    TVar105.ptr_ = "UNUSED_SECTION_NAME";
    TVar105.id_ = 0;
    ctemplate::TemplateDictionary::SetValueAndShowSection(TVar14,TVar76,TVar105);
    local_2d0 = "LATENCY_PREFETCH_URL";
    uStack_2c8 = 0x14;
    local_2c0 = 1;
    uStack_2b8 = 0;
    local_ca0 = 0x79636e6574616c2f;
    uStack_ca8 = 8;
    uStack_c98 = uStack_c98 & 0xffffffffffffff00;
    uStack_2e8 = 8;
    local_2e0 = 0;
    uStack_2d8 = 0;
    local_310 = "LATENCY_PREFETCH";
    uStack_308 = 0x10;
    local_300 = 1;
    uStack_2f8 = 0;
    TVar106._17_7_ = uStack_2ff;
    TVar106.is_immutable_ = true;
    TVar15.length_._0_4_ = 0x14;
    TVar15.ptr_ = "LATENCY_PREFETCH_URL";
    TVar15.length_._4_4_ = 0;
    TVar15._16_4_ = (int)CONCAT71(uStack_2bf,1);
    TVar15._20_4_ = (int)((uint7)uStack_2bf >> 0x18);
    TVar15.id_ = 0;
    TVar77.length_ = 8;
    TVar77.ptr_ = (char *)&local_ca0;
    TVar77._16_8_ = (ulong)uStack_2df << 8;
    TVar77.id_ = 0;
    TVar106.length_ = 0x10;
    TVar106.ptr_ = "LATENCY_PREFETCH";
    TVar106.id_ = 0;
    local_cb0 = (char *)&local_ca0;
    local_2f0 = &local_ca0;
    ctemplate::TemplateDictionary::SetValueAndShowSection(TVar15,TVar77,TVar106);
    if (local_cb0 != (char *)&local_ca0) {
      operator_delete(local_cb0);
    }
    uVar108 = local_ca0;
    local_cb0 = "JAVASCRIPT_FOOTER_SECTION";
    uStack_ca8 = 0x19;
    local_ca0 = CONCAT71(local_ca0._1_7_,1);
    uStack_c98 = 0;
    TVar16.length_._0_4_ = 0x19;
    TVar16.ptr_ = "JAVASCRIPT_FOOTER_SECTION";
    TVar16.length_._4_4_ = 0;
    TVar16._16_4_ = (int)local_ca0;
    TVar16._20_4_ = (int)((ulong)uVar108 >> 0x20);
    TVar16.id_ = 0;
    ctemplate::TemplateDictionary::AddSectionDictionary(TVar16);
    local_330 = "FAST_NEXT_JAVASCRIPT";
    uStack_328 = 0x14;
    local_320 = 1;
    uStack_318 = 0;
    TVar17.length_._0_4_ = 0x14;
    TVar17.ptr_ = "FAST_NEXT_JAVASCRIPT";
    TVar17.length_._4_4_ = 0;
    TVar17._16_4_ = (int)CONCAT71(uStack_31f,1);
    TVar17._20_4_ = (int)((uint7)uStack_31f >> 0x18);
    TVar17.id_ = 0;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar17);
    local_350 = "template_unittest_test_simple.in";
    uStack_348 = 0x20;
    local_340 = 1;
    uStack_338 = 0;
    TVar18.length_._0_4_ = 0x20;
    TVar18.ptr_ = "template_unittest_test_simple.in";
    TVar18.length_._4_4_ = 0;
    TVar18._16_4_ = (int)CONCAT71(uStack_33f,1);
    TVar18._20_4_ = (int)((uint7)uStack_33f >> 0x18);
    TVar18.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar18);
    local_370 = "FAST_NEXT_JAVASCRIPT";
    uStack_368 = 0x14;
    local_360 = 1;
    uStack_358 = 0;
    TVar19.length_._0_4_ = 0x14;
    TVar19.ptr_ = "FAST_NEXT_JAVASCRIPT";
    TVar19.length_._4_4_ = 0;
    TVar19._16_4_ = (int)CONCAT71(uStack_35f,1);
    TVar19._20_4_ = (int)((uint7)uStack_35f >> 0x18);
    TVar19.id_ = 0;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar19);
    __s = INVALID1_FN;
    if (INVALID1_FN == (char *)0x0) {
      __s = "";
    }
    local_390 = __s;
    sStack_388 = strlen(__s);
    local_380 = __s < &__data_start && &UNK_0010452f < __s;
    uStack_378 = 0;
    TVar20.length_._0_4_ = (int)sStack_388;
    TVar20.ptr_ = local_390;
    TVar20.length_._4_4_ = (int)(sStack_388 >> 0x20);
    TVar20._16_4_ = (int)CONCAT71(uStack_37f,local_380);
    TVar20._20_4_ = (int)((uint7)uStack_37f >> 0x18);
    TVar20.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar20);
    local_3b0 = "FAST_NEXT_JAVASCRIPT";
    uStack_3a8 = 0x14;
    local_3a0 = 1;
    uStack_398 = 0;
    TVar21.length_._0_4_ = 0x14;
    TVar21.ptr_ = "FAST_NEXT_JAVASCRIPT";
    TVar21.length_._4_4_ = 0;
    TVar21._16_4_ = (int)CONCAT71(uStack_39f,1);
    TVar21._20_4_ = (int)((uint7)uStack_39f >> 0x18);
    TVar21.id_ = 0;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar21);
    local_3d0 = "template_unittest_test_simple.in";
    uStack_3c8 = 0x20;
    local_3c0 = 1;
    uStack_3b8 = 0;
    TVar22.length_._0_4_ = 0x20;
    TVar22.ptr_ = "template_unittest_test_simple.in";
    TVar22.length_._4_4_ = 0;
    TVar22._16_4_ = (int)CONCAT71(uStack_3bf,1);
    TVar22._20_4_ = (int)((uint7)uStack_3bf >> 0x18);
    TVar22.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar22);
    local_3f0 = "HEAD";
    uStack_3e8 = 4;
    local_3e0 = 1;
    uStack_3d8 = 0;
    local_410 = "head";
    uStack_408 = 4;
    local_400 = 1;
    uStack_3f8 = 0;
    TVar78._17_7_ = uStack_3ff;
    TVar78.is_immutable_ = true;
    TVar23.length_._0_4_ = 4;
    TVar23.ptr_ = "HEAD";
    TVar23.length_._4_4_ = 0;
    TVar23._16_4_ = (int)CONCAT71(uStack_3df,1);
    TVar23._20_4_ = (int)((uint7)uStack_3df >> 0x18);
    TVar23.id_ = 0;
    TVar78.length_ = 4;
    TVar78.ptr_ = "head";
    TVar78.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar23,TVar78);
    local_430 = "JAVASCRIPT_FOOTER_SECTION";
    uStack_428 = 0x19;
    local_420 = 1;
    uStack_418 = 0;
    TVar24.length_._0_4_ = 0x19;
    TVar24.ptr_ = "JAVASCRIPT_FOOTER_SECTION";
    TVar24.length_._4_4_ = 0;
    TVar24._16_4_ = (int)CONCAT71(uStack_41f,1);
    TVar24._20_4_ = (int)((uint7)uStack_41f >> 0x18);
    TVar24.id_ = 0;
    ctemplate::TemplateDictionary::AddSectionDictionary(TVar24);
    local_450 = "FAST_NEXT_JAVASCRIPT";
    uStack_448 = 0x14;
    local_440 = 1;
    uStack_438 = 0;
    TVar25.length_._0_4_ = 0x14;
    TVar25.ptr_ = "FAST_NEXT_JAVASCRIPT";
    TVar25.length_._4_4_ = 0;
    TVar25._16_4_ = (int)CONCAT71(uStack_43f,1);
    TVar25._20_4_ = (int)((uint7)uStack_43f >> 0x18);
    TVar25.id_ = 0;
    pTVar109 = (TemplateModifier *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar25);
    local_470 = "template_unittest_test_simple.in";
    uStack_468 = 0x20;
    local_460 = 1;
    uStack_458 = 0;
    TVar26.length_._0_4_ = 0x20;
    TVar26.ptr_ = "template_unittest_test_simple.in";
    TVar26.length_._4_4_ = 0;
    TVar26._16_4_ = (int)CONCAT71(uStack_45f,1);
    TVar26._20_4_ = (int)((uint7)uStack_45f >> 0x18);
    TVar26.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar26);
    local_490 = "HEAD";
    uStack_488 = 4;
    local_480 = 1;
    uStack_478 = 0;
    local_4b0 = "include-head";
    uStack_4a8 = 0xc;
    local_4a0 = 1;
    uStack_498 = 0;
    TVar79._17_7_ = uStack_49f;
    TVar79.is_immutable_ = true;
    TVar27.length_._0_4_ = 4;
    TVar27.ptr_ = "HEAD";
    TVar27.length_._4_4_ = 0;
    TVar27._16_4_ = (int)CONCAT71(uStack_47f,1);
    TVar27._20_4_ = (int)((uint7)uStack_47f >> 0x18);
    TVar27.id_ = 0;
    TVar79.length_ = 0xc;
    TVar79.ptr_ = "include-head";
    TVar79.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar27,TVar79);
    local_4d0 = "BODY";
    uStack_4c8 = 4;
    local_4c0 = CONCAT31(local_4c0._1_3_,1);
    uStack_4b8 = 0;
    TVar28.length_._0_4_ = 4;
    TVar28.ptr_ = "BODY";
    TVar28.length_._4_4_ = 0;
    TVar28._16_4_ = local_4c0;
    TVar28._20_4_ = uStack_4bc;
    TVar28.id_ = 0;
    ctemplate::TemplateDictionary::SetEscapedFormattedValue
              (TVar28,pTVar109,(char *)&ctemplate::html_escape,0x55555555,"<b>%s</b>: %.4f",
               "<A HREF=/>",in_R8,in_R9);
    local_4f0 = "BI_NEWLINE";
    uStack_4e8 = 10;
    local_4e0 = 1;
    uStack_4d8 = 0;
    local_510 = "";
    uStack_508 = 0;
    local_500 = 1;
    uStack_4f8 = 0;
    TVar80._17_7_ = uStack_4ff;
    TVar80.is_immutable_ = true;
    TVar29.length_._0_4_ = 10;
    TVar29.ptr_ = "BI_NEWLINE";
    TVar29.length_._4_4_ = 0;
    TVar29._16_4_ = (int)CONCAT71(uStack_4df,1);
    TVar29._20_4_ = (int)((uint7)uStack_4df >> 0x18);
    TVar29.id_ = 0;
    TVar80.ptr_ = "";
    TVar80.length_ = 0;
    TVar80.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar29,TVar80);
    local_530 = "FAST_NEXT_JAVASCRIPT";
    uStack_528 = 0x14;
    local_520 = 1;
    uStack_518 = 0;
    TVar30.length_._0_4_ = 0x14;
    TVar30.ptr_ = "FAST_NEXT_JAVASCRIPT";
    TVar30.length_._4_4_ = 0;
    TVar30._16_4_ = (int)CONCAT71(uStack_51f,1);
    TVar30._20_4_ = (int)((uint7)uStack_51f >> 0x18);
    TVar30.id_ = 0;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar30);
    local_550 = "template_unittest_test_html.in";
    uStack_548 = 0x1e;
    local_540 = 1;
    uStack_538 = 0;
    TVar31.length_._0_4_ = 0x1e;
    TVar31.ptr_ = "template_unittest_test_html.in";
    TVar31.length_._4_4_ = 0;
    TVar31._16_4_ = (int)CONCAT71(uStack_53f,1);
    TVar31._20_4_ = (int)((uint7)uStack_53f >> 0x18);
    TVar31.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar31);
    local_570 = "HEAD";
    uStack_568 = 4;
    local_560 = 1;
    uStack_558 = 0;
    local_590 = "should be ignored";
    uStack_588 = 0x11;
    local_580 = 1;
    uStack_578 = 0;
    TVar81._17_7_ = uStack_57f;
    TVar81.is_immutable_ = true;
    TVar32.length_._0_4_ = 4;
    TVar32.ptr_ = "HEAD";
    TVar32.length_._4_4_ = 0;
    TVar32._16_4_ = (int)CONCAT71(uStack_55f,1);
    TVar32._20_4_ = (int)((uint7)uStack_55f >> 0x18);
    TVar32.id_ = 0;
    TVar81.length_ = 0x11;
    TVar81.ptr_ = "should be ignored";
    TVar81.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar32,TVar81);
    local_5b0 = "FAST_NEXT_JAVASCRIPT";
    uStack_5a8 = 0x14;
    local_5a0 = 1;
    uStack_598 = 0;
    TVar33.length_._0_4_ = 0x14;
    TVar33.ptr_ = "FAST_NEXT_JAVASCRIPT";
    TVar33.length_._4_4_ = 0;
    TVar33._16_4_ = (int)CONCAT71(uStack_59f,1);
    TVar33._20_4_ = (int)((uint7)uStack_59f >> 0x18);
    TVar33.id_ = 0;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar33);
    local_5d0 = "DUMMY";
    uStack_5c8 = 5;
    local_5c0 = 1;
    uStack_5b8 = 0;
    local_5f0 = "";
    uStack_5e8 = 0;
    local_5e0 = 1;
    uStack_5d8 = 0;
    local_610 = "NO_MOUSEOVER_FUNCTIONS";
    uStack_608 = 0x16;
    local_600 = 1;
    uStack_5f8 = 0;
    TVar107._17_7_ = uStack_5ff;
    TVar107.is_immutable_ = true;
    TVar82._17_7_ = uStack_5df;
    TVar82.is_immutable_ = true;
    TVar34.length_._0_4_ = 5;
    TVar34.ptr_ = "DUMMY";
    TVar34.length_._4_4_ = 0;
    TVar34._16_4_ = (int)CONCAT71(uStack_5bf,1);
    TVar34._20_4_ = (int)((uint7)uStack_5bf >> 0x18);
    TVar34.id_ = 0;
    TVar82.ptr_ = "";
    TVar82.length_ = 0;
    TVar82.id_ = 0;
    TVar107.length_ = 0x16;
    TVar107.ptr_ = "NO_MOUSEOVER_FUNCTIONS";
    TVar107.id_ = 0;
    ctemplate::TemplateDictionary::SetValueAndShowSection(TVar34,TVar82,TVar107);
    local_630 = "MOUSEOVER_FUNCTIONS";
    uStack_628 = 0x13;
    local_620 = 1;
    uStack_618 = 0;
    TVar35.length_._0_4_ = 0x13;
    TVar35.ptr_ = "MOUSEOVER_FUNCTIONS";
    TVar35.length_._4_4_ = 0;
    TVar35._16_4_ = (int)CONCAT71(uStack_61f,1);
    TVar35._20_4_ = (int)((uint7)uStack_61f >> 0x18);
    TVar35.id_ = 0;
    ctemplate::TemplateDictionary::ShowSection(TVar35);
    local_650 = "MOUSEOVER_JAVASCRIPT";
    uStack_648 = 0x14;
    local_640 = 1;
    uStack_638 = 0;
    TVar36.length_._0_4_ = 0x14;
    TVar36.ptr_ = "MOUSEOVER_JAVASCRIPT";
    TVar36.length_._4_4_ = 0;
    TVar36._16_4_ = (int)CONCAT71(uStack_63f,1);
    TVar36._20_4_ = (int)((uint7)uStack_63f >> 0x18);
    TVar36.id_ = 0;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar36);
    local_cc0 = 0x6e;
    uStack_cbf = 0x5f615f746f;
    uStack_cba = 0x6574;
    uStack_cb8 = 0x6574616c706d;
    uStack_cc8 = 0xe;
    uStack_cb2 = 0;
    uStack_668 = 0xe;
    local_660 = 0;
    uStack_658 = 0;
    TVar37.length_._0_4_ = 0xe;
    TVar37.ptr_ = &local_cc0;
    TVar37.length_._4_4_ = 0;
    TVar37._16_4_ = (int)uStack_65f << 8;
    TVar37._20_4_ = (int)((uint7)uStack_65f >> 0x18);
    TVar37.id_ = 0;
    local_cd0 = &local_cc0;
    local_670 = &local_cc0;
    ctemplate::TemplateDictionary::SetFilename(TVar37);
    if (local_cd0 != &local_cc0) {
      operator_delete(local_cd0);
    }
    local_cd0 = "BI_NEWLINE";
    uStack_cc8 = 10;
    local_cc0 = 1;
    uStack_cb8 = 0;
    uStack_cb2 = 0;
    uStack_cb1 = 0;
    local_690 = "not gonna matter";
    uStack_688 = 0x10;
    local_680 = 1;
    uStack_678 = 0;
    TVar83._17_7_ = uStack_67f;
    TVar83.is_immutable_ = true;
    TVar38.length_._0_4_ = 10;
    TVar38.ptr_ = "BI_NEWLINE";
    TVar38.length_._4_4_ = 0;
    TVar38._16_4_ = (int)CONCAT51(uStack_cbf,1);
    TVar38._20_4_ = (int)(CONCAT26(uStack_cba,CONCAT51(uStack_cbf,1)) >> 0x20);
    TVar38.id_ = 0;
    TVar83.length_ = 0x10;
    TVar83.ptr_ = "not gonna matter";
    TVar83.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar38,TVar83);
    local_6b0 = "GOTO_MESSAGE";
    uStack_6a8 = 0xc;
    local_6a0 = 1;
    uStack_698 = 0;
    local_6d0 = "print \"Go home\"";
    uStack_6c8 = 0xf;
    local_6c0 = 1;
    uStack_6b8 = 0;
    TVar84._17_7_ = uStack_6bf;
    TVar84.is_immutable_ = true;
    TVar39.length_._0_4_ = 0xc;
    TVar39.ptr_ = "GOTO_MESSAGE";
    TVar39.length_._4_4_ = 0;
    TVar39._16_4_ = (int)CONCAT71(uStack_69f,1);
    TVar39._20_4_ = (int)((uint7)uStack_69f >> 0x18);
    TVar39.id_ = 0;
    TVar84.length_ = 0xf;
    TVar84.ptr_ = "print \"Go home\"";
    TVar84.id_ = 0;
    ctemplate::TemplateDictionary::SetEscapedValue(TVar39,TVar84,(TemplateModifier *)this);
    local_6f0 = "UPDATE";
    uStack_6e8 = 6;
    local_6e0 = 1;
    uStack_6d8 = 0;
    local_710 = "monday & tuesday";
    uStack_708 = 0x10;
    local_700 = 1;
    uStack_6f8 = 0;
    TVar85._17_7_ = uStack_6ff;
    TVar85.is_immutable_ = true;
    TVar40.length_._0_4_ = 6;
    TVar40.ptr_ = "UPDATE";
    TVar40.length_._4_4_ = 0;
    TVar40._16_4_ = (int)CONCAT71(uStack_6df,1);
    TVar40._20_4_ = (int)((uint7)uStack_6df >> 0x18);
    TVar40.id_ = 0;
    TVar85.length_ = 0x10;
    TVar85.ptr_ = "monday & tuesday";
    TVar85.id_ = 0;
    ctemplate::TemplateDictionary::SetEscapedValue(TVar40,TVar85,(TemplateModifier *)this);
    local_730 = "UPDATE_SECTION";
    uStack_728 = 0xe;
    local_720 = 1;
    uStack_718 = 0;
    TVar41.length_._0_4_ = 0xe;
    TVar41.ptr_ = "UPDATE_SECTION";
    TVar41.length_._4_4_ = 0;
    TVar41._16_4_ = (int)CONCAT71(uStack_71f,1);
    TVar41._20_4_ = (int)((uint7)uStack_71f >> 0x18);
    TVar41.id_ = 0;
    ctemplate::TemplateDictionary::ShowSection(TVar41);
    local_750 = "ALIGNMENT";
    uStack_748 = 9;
    local_740 = 1;
    uStack_738 = 0;
    local_770 = "\"right\"";
    uStack_768 = 7;
    local_760 = 1;
    uStack_758 = 0;
    TVar86._17_7_ = uStack_75f;
    TVar86.is_immutable_ = true;
    TVar42.length_._0_4_ = 9;
    TVar42.ptr_ = "ALIGNMENT";
    TVar42.length_._4_4_ = 0;
    TVar42._16_4_ = (int)CONCAT71(uStack_73f,1);
    TVar42._20_4_ = (int)((uint7)uStack_73f >> 0x18);
    TVar42.id_ = 0;
    TVar86.length_ = 7;
    TVar86.ptr_ = "\"right\"";
    TVar86.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar42,TVar86);
    uVar110 = 0;
    do {
      local_790 = "RESULTS";
      uStack_788 = 7;
      local_780 = 1;
      uStack_778 = 0;
      TVar43.length_._0_4_ = 7;
      TVar43.ptr_ = "RESULTS";
      TVar43.length_._4_4_ = 0;
      TVar43._16_4_ = (int)CONCAT71(uStack_77f,1);
      TVar43._20_4_ = (int)((uint7)uStack_77f >> 0x18);
      TVar43.id_ = 0;
      pTVar109 = (TemplateModifier *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar43);
      if ((uVar110 & 1) == 0) {
        local_7b0 = "WHITE_BG";
        uStack_7a8 = 8;
        local_7a0 = 1;
        uStack_798 = 0;
        TVar44.length_._0_4_ = 8;
        TVar44.ptr_ = "WHITE_BG";
        TVar44.length_._4_4_ = 0;
        TVar44._16_4_ = (int)CONCAT71(uStack_79f,1);
        TVar44._20_4_ = (int)((uint7)uStack_79f >> 0x18);
        TVar44.id_ = 0;
        ctemplate::TemplateDictionary::ShowSection(TVar44);
      }
      local_7d0 = "RESULT";
      uStack_7c8 = 6;
      _local_7c0 = CONCAT31(uStack_7bf,1);
      uStack_7b8 = 0;
      ctemplate::TemplateDictionary::SetFormattedValue
                (pTVar109,"<&>\"result\" #%d\'&\'",uVar110 & 0xffffffff);
      local_7f0 = "XML_RESULT";
      uStack_7e8 = 10;
      local_7e0 = CONCAT31(local_7e0._1_3_,1);
      uStack_7d8 = 0;
      TVar45.length_._0_4_ = 10;
      TVar45.ptr_ = "XML_RESULT";
      TVar45.length_._4_4_ = 0;
      TVar45._16_4_ = local_7e0;
      TVar45._20_4_ = uStack_7dc;
      TVar45.id_ = 0;
      ctemplate::TemplateDictionary::SetEscapedFormattedValue
                (TVar45,pTVar109,(char *)&ctemplate::xml_escape,"<&>\"result\" #%d\'&\'",
                 uVar110 & 0xffffffff,in_R8,in_R9);
      local_810 = "GOODNESS";
      uStack_808 = 8;
      local_800 = 1;
      uStack_7f8 = 0;
      TVar46.length_._0_4_ = 8;
      TVar46.ptr_ = "GOODNESS";
      TVar46.length_._4_4_ = 0;
      TVar46._16_4_ = (int)CONCAT71(uStack_7ff,1);
      TVar46._20_4_ = (int)((uint7)uStack_7ff >> 0x18);
      TVar46.id_ = 0;
      ctemplate::TemplateDictionary::SetIntValue(TVar46,(long)pTVar109);
      uVar110 = uVar110 + 1;
    } while (uVar110 != 3);
    local_830 = "AE_TITLE_GOOD";
    uStack_828 = 0xd;
    local_820 = 1;
    uStack_818 = 0;
    local_850 = "Hello World!";
    uStack_848 = 0xc;
    local_840 = 1;
    uStack_838 = 0;
    TVar87._17_7_ = uStack_83f;
    TVar87.is_immutable_ = true;
    TVar47.length_._0_4_ = 0xd;
    TVar47.ptr_ = "AE_TITLE_GOOD";
    TVar47.length_._4_4_ = 0;
    TVar47._16_4_ = (int)CONCAT71(uStack_81f,1);
    TVar47._20_4_ = (int)((uint7)uStack_81f >> 0x18);
    TVar47.id_ = 0;
    TVar87.length_ = 0xc;
    TVar87.ptr_ = "Hello World!";
    TVar87.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar47,TVar87);
    local_870 = "AE_TITLE_BAD";
    uStack_868 = 0xc;
    local_860 = 1;
    uStack_858 = 0;
    local_890 = "Hello <script>alert(1)</script> World!";
    uStack_888 = 0x26;
    local_880 = 1;
    uStack_878 = 0;
    TVar88._17_7_ = uStack_87f;
    TVar88.is_immutable_ = true;
    TVar48.length_._0_4_ = 0xc;
    TVar48.ptr_ = "AE_TITLE_BAD";
    TVar48.length_._4_4_ = 0;
    TVar48._16_4_ = (int)CONCAT71(uStack_85f,1);
    TVar48._20_4_ = (int)((uint7)uStack_85f >> 0x18);
    TVar48.id_ = 0;
    TVar88.length_ = 0x26;
    TVar88.ptr_ = "Hello <script>alert(1)</script> World!";
    TVar88.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar48,TVar88);
    local_8b0 = "AE_URL_GOOD";
    uStack_8a8 = 0xb;
    local_8a0 = 1;
    uStack_898 = 0;
    local_8d0 = "http://www.google.com/";
    uStack_8c8 = 0x16;
    local_8c0 = 1;
    uStack_8b8 = 0;
    TVar89._17_7_ = uStack_8bf;
    TVar89.is_immutable_ = true;
    TVar49.length_._0_4_ = 0xb;
    TVar49.ptr_ = "AE_URL_GOOD";
    TVar49.length_._4_4_ = 0;
    TVar49._16_4_ = (int)CONCAT71(uStack_89f,1);
    TVar49._20_4_ = (int)((uint7)uStack_89f >> 0x18);
    TVar49.id_ = 0;
    TVar89.length_ = 0x16;
    TVar89.ptr_ = "http://www.google.com/";
    TVar89.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar49,TVar89);
    local_8f0 = "AE_URL_BAD";
    uStack_8e8 = 10;
    local_8e0 = 1;
    uStack_8d8 = 0;
    local_910 = "javascript:alert(1)";
    uStack_908 = 0x13;
    local_900 = 1;
    uStack_8f8 = 0;
    TVar90._17_7_ = uStack_8ff;
    TVar90.is_immutable_ = true;
    TVar50.length_._0_4_ = 10;
    TVar50.ptr_ = "AE_URL_BAD";
    TVar50.length_._4_4_ = 0;
    TVar50._16_4_ = (int)CONCAT71(uStack_8df,1);
    TVar50._20_4_ = (int)((uint7)uStack_8df >> 0x18);
    TVar50.id_ = 0;
    TVar90.length_ = 0x13;
    TVar90.ptr_ = "javascript:alert(1)";
    TVar90.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar50,TVar90);
    local_930 = "AE_BG_COLOR_GOOD";
    uStack_928 = 0x10;
    local_920 = 1;
    uStack_918 = 0;
    local_950 = "red";
    uStack_948 = 3;
    local_940 = 1;
    uStack_938 = 0;
    TVar91._17_7_ = uStack_93f;
    TVar91.is_immutable_ = true;
    TVar51.length_._0_4_ = 0x10;
    TVar51.ptr_ = "AE_BG_COLOR_GOOD";
    TVar51.length_._4_4_ = 0;
    TVar51._16_4_ = (int)CONCAT71(uStack_91f,1);
    TVar51._20_4_ = (int)((uint7)uStack_91f >> 0x18);
    TVar51.id_ = 0;
    TVar91.length_ = 3;
    TVar91.ptr_ = "red";
    TVar91.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar51,TVar91);
    local_970 = "AE_BG_COLOR_BAD";
    uStack_968 = 0xf;
    local_960 = 1;
    uStack_958 = 0;
    local_990 = "evil! &";
    uStack_988 = 7;
    local_980 = 1;
    uStack_978 = 0;
    TVar92._17_7_ = uStack_97f;
    TVar92.is_immutable_ = true;
    TVar52.length_._0_4_ = 0xf;
    TVar52.ptr_ = "AE_BG_COLOR_BAD";
    TVar52.length_._4_4_ = 0;
    TVar52._16_4_ = (int)CONCAT71(uStack_95f,1);
    TVar52._20_4_ = (int)((uint7)uStack_95f >> 0x18);
    TVar52.id_ = 0;
    TVar92.length_ = 7;
    TVar92.ptr_ = "evil! &";
    TVar92.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar52,TVar92);
    local_9b0 = "AE_JS_GOOD";
    uStack_9a8 = 10;
    local_9a0 = 1;
    uStack_998 = 0;
    local_9d0 = "your text here";
    uStack_9c8 = 0xe;
    local_9c0 = 1;
    uStack_9b8 = 0;
    TVar93._17_7_ = uStack_9bf;
    TVar93.is_immutable_ = true;
    TVar53.length_._0_4_ = 10;
    TVar53.ptr_ = "AE_JS_GOOD";
    TVar53.length_._4_4_ = 0;
    TVar53._16_4_ = (int)CONCAT71(uStack_99f,1);
    TVar53._20_4_ = (int)((uint7)uStack_99f >> 0x18);
    TVar53.id_ = 0;
    TVar93.length_ = 0xe;
    TVar93.ptr_ = "your text here";
    TVar93.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar53,TVar93);
    local_9f0 = "AE_JS_BAD";
    uStack_9e8 = 9;
    local_9e0 = 1;
    uStack_9d8 = 0;
    local_a10 = "your text\'is clever\'thanks";
    uStack_a08 = 0x1a;
    local_a00 = 1;
    uStack_9f8 = 0;
    TVar94._17_7_ = uStack_9ff;
    TVar94.is_immutable_ = true;
    TVar54.length_._0_4_ = 9;
    TVar54.ptr_ = "AE_JS_BAD";
    TVar54.length_._4_4_ = 0;
    TVar54._16_4_ = (int)CONCAT71(uStack_9df,1);
    TVar54._20_4_ = (int)((uint7)uStack_9df >> 0x18);
    TVar54.id_ = 0;
    TVar94.length_ = 0x1a;
    TVar94.ptr_ = "your text\'is clever\'thanks";
    TVar94.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar54,TVar94);
    local_a30 = "AE_USERNAME_GOOD";
    uStack_a28 = 0x10;
    local_a20 = 1;
    uStack_a18 = 0;
    local_a50 = "Mr. Nice";
    uStack_a48 = 8;
    local_a40 = 1;
    uStack_a38 = 0;
    TVar95._17_7_ = uStack_a3f;
    TVar95.is_immutable_ = true;
    TVar55.length_._0_4_ = 0x10;
    TVar55.ptr_ = "AE_USERNAME_GOOD";
    TVar55.length_._4_4_ = 0;
    TVar55._16_4_ = (int)CONCAT71(uStack_a1f,1);
    TVar55._20_4_ = (int)((uint7)uStack_a1f >> 0x18);
    TVar55.id_ = 0;
    TVar95.length_ = 8;
    TVar95.ptr_ = "Mr. Nice";
    TVar95.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar55,TVar95);
    local_a70 = "AE_USERNAME_BAD";
    uStack_a68 = 0xf;
    local_a60 = 1;
    uStack_a58 = 0;
    local_a90 = "Doctor<script>alert(2)</script>Evil";
    uStack_a88 = 0x23;
    local_a80 = 1;
    uStack_a78 = 0;
    TVar96._17_7_ = uStack_a7f;
    TVar96.is_immutable_ = true;
    TVar56.length_._0_4_ = 0xf;
    TVar56.ptr_ = "AE_USERNAME_BAD";
    TVar56.length_._4_4_ = 0;
    TVar56._16_4_ = (int)CONCAT71(uStack_a5f,1);
    TVar56._20_4_ = (int)((uint7)uStack_a5f >> 0x18);
    TVar56.id_ = 0;
    TVar96.length_ = 0x23;
    TVar96.ptr_ = "Doctor<script>alert(2)</script>Evil";
    TVar96.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar56,TVar96);
    local_ab0 = "AE_START_EDGE";
    uStack_aa8 = 0xd;
    local_aa0 = 1;
    uStack_a98 = 0;
    local_ad0 = "left";
    uStack_ac8 = 4;
    local_ac0 = 1;
    uStack_ab8 = 0;
    TVar97._17_7_ = uStack_abf;
    TVar97.is_immutable_ = true;
    TVar57.length_._0_4_ = 0xd;
    TVar57.ptr_ = "AE_START_EDGE";
    TVar57.length_._4_4_ = 0;
    TVar57._16_4_ = (int)CONCAT71(uStack_a9f,1);
    TVar57._20_4_ = (int)((uint7)uStack_a9f >> 0x18);
    TVar57.id_ = 0;
    TVar97.length_ = 4;
    TVar97.ptr_ = "left";
    TVar97.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar57,TVar97);
    local_af0 = "AE_END_EDGE";
    uStack_ae8 = 0xb;
    local_ae0 = 1;
    uStack_ad8 = 0;
    local_b10 = ";:center()$$";
    uStack_b08 = 0xc;
    local_b00 = 1;
    uStack_af8 = 0;
    TVar98._17_7_ = uStack_aff;
    TVar98.is_immutable_ = true;
    TVar58.length_._0_4_ = 0xb;
    TVar58.ptr_ = "AE_END_EDGE";
    TVar58.length_._4_4_ = 0;
    TVar58._16_4_ = (int)CONCAT71(uStack_adf,1);
    TVar58._20_4_ = (int)((uint7)uStack_adf >> 0x18);
    TVar58.id_ = 0;
    TVar98.length_ = 0xc;
    TVar98.ptr_ = ";:center()$$";
    TVar98.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar58,TVar98);
    local_b30 = "AE_FONT_SIZE_PC";
    uStack_b28 = 0xf;
    local_b20 = 1;
    uStack_b18 = 0;
    local_b50 = "120%";
    uStack_b48 = 4;
    local_b40 = 1;
    uStack_b38 = 0;
    TVar99._17_7_ = uStack_b3f;
    TVar99.is_immutable_ = true;
    TVar59.length_._0_4_ = 0xf;
    TVar59.ptr_ = "AE_FONT_SIZE_PC";
    TVar59.length_._4_4_ = 0;
    TVar59._16_4_ = (int)CONCAT71(uStack_b1f,1);
    TVar59._20_4_ = (int)((uint7)uStack_b1f >> 0x18);
    TVar59.id_ = 0;
    TVar99.length_ = 4;
    TVar99.ptr_ = "120%";
    TVar99.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar59,TVar99);
    local_b70 = "AE_FONT_SIZE_PT";
    uStack_b68 = 0xf;
    local_b60 = 1;
    uStack_b58 = 0;
    local_b90 = "12pt";
    uStack_b88 = 4;
    local_b80 = 1;
    uStack_b78 = 0;
    TVar100._17_7_ = uStack_b7f;
    TVar100.is_immutable_ = true;
    TVar60.length_._0_4_ = 0xf;
    TVar60.ptr_ = "AE_FONT_SIZE_PT";
    TVar60.length_._4_4_ = 0;
    TVar60._16_4_ = (int)CONCAT71(uStack_b5f,1);
    TVar60._20_4_ = (int)((uint7)uStack_b5f >> 0x18);
    TVar60.id_ = 0;
    TVar100.length_ = 4;
    TVar100.ptr_ = "12pt";
    TVar100.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar60,TVar100);
    local_bb0 = "AE_MAUVE_RGB";
    uStack_ba8 = 0xc;
    local_ba0 = 1;
    uStack_b98 = 0;
    local_bd0 = "#FF7BD5";
    uStack_bc8 = 7;
    local_bc0 = 1;
    uStack_bb8 = 0;
    TVar101._17_7_ = uStack_bbf;
    TVar101.is_immutable_ = true;
    TVar61.length_._0_4_ = 0xc;
    TVar61.ptr_ = "AE_MAUVE_RGB";
    TVar61.length_._4_4_ = 0;
    TVar61._16_4_ = (int)CONCAT71(uStack_b9f,1);
    TVar61._20_4_ = (int)((uint7)uStack_b9f >> 0x18);
    TVar61.id_ = 0;
    TVar101.length_ = 7;
    TVar101.ptr_ = "#FF7BD5";
    TVar101.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar61,TVar101);
    local_bf0 = "AE_ITALIC";
    uStack_be8 = 9;
    local_be0 = 1;
    uStack_bd8 = 0;
    local_c10 = "italic";
    uStack_c08 = 6;
    local_c00 = 1;
    uStack_bf8 = 0;
    TVar102._17_7_ = uStack_bff;
    TVar102.is_immutable_ = true;
    TVar62.length_._0_4_ = 9;
    TVar62.ptr_ = "AE_ITALIC";
    TVar62.length_._4_4_ = 0;
    TVar62._16_4_ = (int)CONCAT71(uStack_bdf,1);
    TVar62._20_4_ = (int)((uint7)uStack_bdf >> 0x18);
    TVar62.id_ = 0;
    TVar102.length_ = 6;
    TVar102.ptr_ = "italic";
    TVar102.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar62,TVar102);
    local_c30 = "FOOTER";
    uStack_c28 = 6;
    local_c20 = 1;
    uStack_c18 = 0;
    TVar63.length_._0_4_ = 6;
    TVar63.ptr_ = "FOOTER";
    TVar63.length_._4_4_ = 0;
    TVar63._16_4_ = (int)CONCAT71(uStack_c1f,1);
    TVar63._20_4_ = (int)((uint7)uStack_c1f >> 0x18);
    TVar63.id_ = 0;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar63);
    local_c50 = "template_unittest_test_footer.in";
    uStack_c48 = 0x20;
    local_c40 = 1;
    uStack_c38 = 0;
    TVar64.length_._0_4_ = 0x20;
    TVar64.ptr_ = "template_unittest_test_footer.in";
    TVar64.length_._4_4_ = 0;
    TVar64._16_4_ = (int)CONCAT71(uStack_c3f,1);
    TVar64._20_4_ = (int)((uint7)uStack_c3f >> 0x18);
    TVar64.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar64);
    local_c70 = "SIMPLE";
    uStack_c68 = 6;
    local_c60 = 1;
    uStack_c58 = 0;
    TVar65.length_._0_4_ = 6;
    TVar65.ptr_ = "SIMPLE";
    TVar65.length_._4_4_ = 0;
    TVar65._16_4_ = (int)CONCAT71(uStack_c5f,1);
    TVar65._20_4_ = (int)((uint7)uStack_c5f >> 0x18);
    TVar65.id_ = 0;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar65);
    local_c90 = "template_unittest_test_simple.in";
    uStack_c88 = 0x20;
    local_c80 = 1;
    uStack_c78 = 0;
    TVar66.length_._0_4_ = 0x20;
    TVar66.ptr_ = "template_unittest_test_simple.in";
    TVar66.length_._4_4_ = 0;
    TVar66._16_4_ = (int)CONCAT71(uStack_c7f,1);
    TVar66._20_4_ = (int)((uint7)uStack_c7f >> 0x18);
    TVar66.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar66);
  }
  return this;
}

Assistant:

static TemplateDictionary* MakeDictionary(int i) {
  switch (i) {
    case 1: return MakeDict1();
    case 2: return MakeDict2();
    case 3: return MakeDict3();
    default: ASSERT(false);  // No dictionary with this number yet.
  }
  return NULL;
}